

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLcode curl_easy_upkeep(Curl_easy *data)

{
  Curl_multi *pCVar1;
  CURLcode CVar2;
  curltime cVar3;
  time_t local_28;
  int local_20;
  
  CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
  if ((data != (Curl_easy *)0x0) && (data->magic == 0xc0dedbad)) {
    pCVar1 = data->multi_easy;
    CVar2 = CURLE_OK;
    if (pCVar1 != (Curl_multi *)0x0) {
      cVar3 = Curl_now();
      local_28 = cVar3.tv_sec;
      local_20 = cVar3.tv_usec;
      Curl_conncache_foreach(data,&pCVar1->conn_cache,&local_28,conn_upkeep);
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLcode curl_easy_upkeep(struct Curl_easy *data)
{
  /* Verify that we got an easy handle we can work with. */
  if(!GOOD_EASY_HANDLE(data))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->multi_easy) {
    /* Use the common function to keep connections alive. */
    return upkeep(&data->multi_easy->conn_cache, data);
  }
  else {
    /* No connections, so just return success */
    return CURLE_OK;
  }
}